

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O1

CharFormat testing::internal::PrintAsStringLiteralTo(char32_t c,ostream *os)

{
  undefined4 uVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  undefined8 in_RAX;
  char *pcVar4;
  undefined8 uStack_28;
  
  if (c < L'\"') {
    switch(c) {
    case L'\0':
      pcVar4 = "\\0";
      break;
    default:
      goto switchD_00158ce3_caseD_1;
    case L'\a':
      pcVar4 = "\\a";
      break;
    case L'\b':
      pcVar4 = "\\b";
      break;
    case L'\t':
      pcVar4 = "\\t";
      break;
    case L'\n':
      pcVar4 = "\\n";
      break;
    case L'\v':
      pcVar4 = "\\v";
      break;
    case L'\f':
      pcVar4 = "\\f";
      break;
    case L'\r':
      pcVar4 = "\\r";
    }
LAB_00158d58:
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,2);
    return kSpecialEscape;
  }
  if (c == L'\"') {
    pcVar4 = "\\\"";
    goto LAB_00158d58;
  }
  if (c == L'\\') {
    pcVar4 = "\\\\";
    goto LAB_00158d58;
  }
  if (c == L'\'') {
    pcVar4 = "\'";
    uStack_28 = in_RAX;
    goto LAB_00158d85;
  }
switchD_00158ce3_caseD_1:
  if (0x5e < (uint)(c + L'\xffffffe0')) {
    uVar1 = *(undefined4 *)(&os->field_0x18 + (long)os->_vptr_basic_ostream[-3]);
    std::__ostream_insert<char,std::char_traits<char>>(os,"\\x",2);
    pp_Var2 = os->_vptr_basic_ostream;
    p_Var3 = pp_Var2[-3];
    *(uint *)(&os->field_0x18 + (long)p_Var3) =
         *(uint *)(&os->field_0x18 + (long)p_Var3) & 0xffffffb5 | 8;
    *(uint *)(&os->field_0x18 + (long)pp_Var2[-3]) =
         *(uint *)(&os->field_0x18 + (long)pp_Var2[-3]) | 0x4000;
    std::ostream::operator<<(os,c);
    *(undefined4 *)(&os->field_0x18 + (long)os->_vptr_basic_ostream[-3]) = uVar1;
    return kHexEscape;
  }
  pcVar4 = (char *)((long)&uStack_28 + 7);
  uStack_28 = CONCAT17((char)c,(int7)in_RAX);
LAB_00158d85:
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,1);
  return kAsIs;
}

Assistant:

static CharFormat PrintAsStringLiteralTo(char32_t c, ostream* os) {
  switch (c) {
    case L'\'':
      *os << "'";
      return kAsIs;
    case L'"':
      *os << "\\\"";
      return kSpecialEscape;
    default:
      return PrintAsCharLiteralTo(c, os);
  }
}